

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolBuilders.cpp
# Opt level: O2

void __thiscall slang::ast::MethodBuilder::~MethodBuilder(MethodBuilder *this)

{
  SubroutineSymbol *pSVar1;
  int iVar2;
  undefined4 extraout_var;
  EVP_PKEY_CTX *in_RDX;
  size_t extraout_RDX;
  Compilation *in_RSI;
  
  if ((this->args).super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.len != 0) {
    in_RSI = this->compilation;
    pSVar1 = this->symbol;
    iVar2 = SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::copy
                      (&(this->args).super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>
                       ,(EVP_PKEY_CTX *)in_RSI,in_RDX);
    (pSVar1->arguments)._M_ptr = (pointer)CONCAT44(extraout_var,iVar2);
    (pSVar1->arguments)._M_extent._M_extent_value = extraout_RDX;
    if ((pSVar1->cachedHasOutputArgs).super__Optional_base<bool,_true,_true>._M_payload.
        super__Optional_payload_base<bool>._M_engaged == true) {
      (pSVar1->cachedHasOutputArgs).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged = false;
    }
  }
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::cleanup
            (&(this->args).super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>,
             (EVP_PKEY_CTX *)in_RSI);
  return;
}

Assistant:

MethodBuilder::~MethodBuilder() {
    if (!args.empty())
        symbol.setArguments(args.copy(compilation));
}